

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void __thiscall kratos::DebugDatabase::compute_generators(DebugDatabase *this,Generator *top)

{
  Generator *pGVar1;
  undefined1 local_88 [8];
  GeneratorGraph g;
  vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> generators;
  Generator *gen;
  
  this->top_ = top;
  GeneratorGraph::GeneratorGraph((GeneratorGraph *)local_88,top);
  GeneratorGraph::get_sorted_nodes
            ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)&g.root_,
             (GeneratorGraph *)local_88);
  for (pGVar1 = g.root_;
      pGVar1 != (Generator *)
                generators.
                super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pGVar1 = (Generator *)&(pGVar1->super_IRNode).fn_name_ln) {
    generators.super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)(pGVar1->super_IRNode)._vptr_IRNode;
    std::
    _Hashtable<kratos::Generator*,kratos::Generator*,std::allocator<kratos::Generator*>,std::__detail::_Identity,std::equal_to<kratos::Generator*>,std::hash<kratos::Generator*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_M_emplace<kratos::Generator*&>
              ((_Hashtable<kratos::Generator*,kratos::Generator*,std::allocator<kratos::Generator*>,std::__detail::_Identity,std::equal_to<kratos::Generator*>,std::hash<kratos::Generator*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&this->generators_,
               &generators.
                super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::_Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::~_Vector_base
            ((_Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)&g.root_);
  std::
  _Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_88);
  return;
}

Assistant:

void DebugDatabase::compute_generators(Generator *top) {
    top_ = top;
    GeneratorGraph g(top);
    auto generators = g.get_sorted_nodes();
    for (auto *gen : generators) {
        generators_.emplace(gen);
    }
}